

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

size_t ecpCreateJ_deep(size_t n,size_t f_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  
  lVar5 = n * 0x10 + f_deep;
  sVar1 = ecpAddJ_deep(n,f_deep);
  sVar2 = ecpAddAJ_deep(n,f_deep);
  sVar3 = ecpSubJ_deep(n,f_deep);
  sVar4 = ecpSubAJ_deep(n,f_deep);
  sVar1 = utilMax(0xb,n * 8,lVar5,sVar1,sVar2,sVar3,sVar4,lVar5,lVar5,n * 0x20 + f_deep,
                  n * 0x40 + f_deep,n * 0x38 + f_deep);
  return sVar1;
}

Assistant:

size_t ecpCreateJ_deep(size_t n, size_t f_deep)
{
	return utilMax(11,
		O_OF_W(n),
		ecpToAJ_deep(n, f_deep),
		ecpAddJ_deep(n, f_deep),
		ecpAddAJ_deep(n, f_deep),
		ecpSubJ_deep(n, f_deep),
		ecpSubAJ_deep(n, f_deep),
		ecpDblJ_deep(n, f_deep),
		ecpDblJA3_deep(n, f_deep),
		ecpDblAJ_deep(n, f_deep),
		ecpTplJ_deep(n, f_deep),
		ecpTplJA3_deep(n, f_deep));
}